

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ami_nvar.cpp
# Opt level: O0

uint16_t __thiscall
ami_nvar_t::nvar_entry_body_t::extended_header_size_field(nvar_entry_body_t *this)

{
  kstream *pkVar1;
  bool bVar2;
  uint16_t uVar3;
  nvar_entry_t *pnVar4;
  nvar_attributes_t *pnVar5;
  uint64_t uVar6;
  kstream *this_00;
  undefined1 local_28 [8];
  streampos _pos;
  nvar_entry_body_t *this_local;
  
  if ((this->f_extended_header_size_field & 1U) == 0) {
    this->n_extended_header_size_field = true;
    _pos._M_state = (__mbstate_t)this;
    pnVar4 = _parent(this);
    pnVar5 = nvar_entry_t::attributes(pnVar4);
    bVar2 = nvar_attributes_t::valid(pnVar5);
    if (bVar2) {
      pnVar4 = _parent(this);
      pnVar5 = nvar_entry_t::attributes(pnVar4);
      bVar2 = nvar_attributes_t::extended_header(pnVar5);
      if (bVar2) {
        pnVar4 = _parent(this);
        uVar3 = nvar_entry_t::size(pnVar4);
        if (0xc < uVar3) {
          this->n_extended_header_size_field = false;
          uVar6 = kaitai::kstream::pos((this->super_kstruct).m__io);
          std::fpos<__mbstate_t>::fpos((fpos<__mbstate_t> *)local_28,uVar6);
          pkVar1 = (this->super_kstruct).m__io;
          this_00 = kaitai::kstruct::_io(&this->super_kstruct);
          uVar6 = kaitai::kstream::pos(this_00);
          kaitai::kstream::seek(pkVar1,uVar6 - 2);
          uVar3 = kaitai::kstream::read_u2le((this->super_kstruct).m__io);
          this->m_extended_header_size_field = uVar3;
          pkVar1 = (this->super_kstruct).m__io;
          uVar6 = std::fpos::operator_cast_to_long((fpos *)local_28);
          kaitai::kstream::seek(pkVar1,uVar6);
          this->f_extended_header_size_field = true;
        }
      }
    }
    this_local._6_2_ = this->m_extended_header_size_field;
  }
  else {
    this_local._6_2_ = this->m_extended_header_size_field;
  }
  return this_local._6_2_;
}

Assistant:

uint16_t ami_nvar_t::nvar_entry_body_t::extended_header_size_field() {
    if (f_extended_header_size_field)
        return m_extended_header_size_field;
    n_extended_header_size_field = true;
    if ( ((_parent()->attributes()->valid()) && (_parent()->attributes()->extended_header()) && (_parent()->size() > (((4 + 2) + 4) + 2))) ) {
        n_extended_header_size_field = false;
        std::streampos _pos = m__io->pos();
        m__io->seek((_io()->pos() - 2));
        m_extended_header_size_field = m__io->read_u2le();
        m__io->seek(_pos);
        f_extended_header_size_field = true;
    }
    return m_extended_header_size_field;
}